

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O0

void t1_dec_sigpass(opj_t1_t *t1,OPJ_INT32 bpno,OPJ_UINT32 orient,OPJ_BYTE type,OPJ_UINT32 cblksty)

{
  undefined4 in_ESI;
  long in_RDI;
  bool bVar1;
  OPJ_INT32 *unaff_retaddr;
  flag_t *in_stack_00000008;
  opj_t1_t *in_stack_00000010;
  OPJ_INT32 oneplushalf;
  OPJ_INT32 half;
  OPJ_INT32 one;
  OPJ_UINT32 vsc;
  OPJ_UINT32 k;
  OPJ_UINT32 j;
  OPJ_UINT32 i;
  uint local_24;
  uint local_20;
  uint local_1c;
  
  for (local_24 = 0; local_24 < *(uint *)(in_RDI + 0x2c); local_24 = local_24 + 4) {
    for (local_1c = 0; local_1c < *(uint *)(in_RDI + 0x28); local_1c = local_1c + 1) {
      local_20 = local_24;
      while( true ) {
        bVar1 = false;
        if (local_20 < local_24 + 4) {
          bVar1 = local_20 < *(uint *)(in_RDI + 0x2c);
        }
        if (!bVar1) break;
        t1_dec_sigpass_step(in_stack_00000010,in_stack_00000008,unaff_retaddr,
                            (OPJ_UINT32)((ulong)in_RDI >> 0x20),(OPJ_INT32)in_RDI,
                            (OPJ_BYTE)((uint)in_ESI >> 0x18),vsc);
        local_20 = local_20 + 1;
      }
    }
  }
  return;
}

Assistant:

static void t1_dec_sigpass(
		opj_t1_t *t1,
		OPJ_INT32 bpno,
		OPJ_UINT32 orient,
		OPJ_BYTE type,
		OPJ_UINT32 cblksty)
{
	OPJ_UINT32 i, j, k, vsc;
	OPJ_INT32 one, half, oneplushalf;
	one = 1 << bpno;
	half = one >> 1;
	oneplushalf = one | half;
	for (k = 0; k < t1->h; k += 4) {
		for (i = 0; i < t1->w; ++i) {
			for (j = k; j < k + 4 && j < t1->h; ++j) {
				vsc = ((cblksty & J2K_CCP_CBLKSTY_VSC) && (j == k + 3 || j == t1->h - 1)) ? 1 : 0;
				t1_dec_sigpass_step(
						t1,
						&t1->flags[((j+1) * t1->flags_stride) + i + 1],
						&t1->data[(j * t1->w) + i],
						orient,
						oneplushalf,
						type,
						vsc);
			}
		}
	}
}